

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scd_pcm.c
# Opt level: O2

void SCD_PCM_MemBlockWrite(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  pcm_chip_ *chip;
  
  uVar1 = *(uint *)((long)info + 0xf4);
  if (offset <= uVar1 && uVar1 - offset != 0) {
    __n = (ulong)(uVar1 - offset);
    if (length + offset <= uVar1) {
      __n = (ulong)length;
    }
    memcpy((void *)((ulong)offset + *(long *)((long)info + 0xf8)),data,__n);
    return;
  }
  return;
}

Assistant:

static void SCD_PCM_MemBlockWrite(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	struct pcm_chip_ *chip = (struct pcm_chip_ *)info;
	
	// offset is absolute here
	if (offset >= chip->RAMSize)
		return;
	if (offset + length > chip->RAMSize)
		length = chip->RAMSize - offset;
	
	memcpy(chip->RAM + offset, data, length);
	
	return;
}